

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialShellKirchhoff.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChMaterialShellKirchhoff::ChMaterialShellKirchhoff
          (ChMaterialShellKirchhoff *this,
          shared_ptr<chrono::fea::ChElasticityKirchhoff> *melasticity,
          shared_ptr<chrono::fea::ChPlasticityKirchhoff> *mplasticity)

{
  __shared_ptr<chrono::fea::ChPlasticityKirchhoff,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  __shared_ptr<chrono::fea::ChElasticityKirchhoff,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  this->_vptr_ChMaterialShellKirchhoff = (_func_int **)&PTR__ChMaterialShellKirchhoff_01177ac8;
  (this->elasticity).
  super___shared_ptr<chrono::fea::ChElasticityKirchhoff,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->elasticity).
  super___shared_ptr<chrono::fea::ChElasticityKirchhoff,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->plasticity).
  super___shared_ptr<chrono::fea::ChPlasticityKirchhoff,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->plasticity).
  super___shared_ptr<chrono::fea::ChPlasticityKirchhoff,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->plasticity).
  super___shared_ptr<chrono::fea::ChPlasticityKirchhoff,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->plasticity).
  super___shared_ptr<chrono::fea::ChPlasticityKirchhoff,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->damping).super___shared_ptr<chrono::fea::ChDampingKirchhoff,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->damping).super___shared_ptr<chrono::fea::ChDampingKirchhoff,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<chrono::fea::ChElasticityKirchhoff,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_28,
             &melasticity->
              super___shared_ptr<chrono::fea::ChElasticityKirchhoff,_(__gnu_cxx::_Lock_policy)2>);
  SetElasticity(this,(shared_ptr<chrono::fea::ChElasticityKirchhoff> *)&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  std::__shared_ptr<chrono::fea::ChPlasticityKirchhoff,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_38,
             &mplasticity->
              super___shared_ptr<chrono::fea::ChPlasticityKirchhoff,_(__gnu_cxx::_Lock_policy)2>);
  SetPlasticity(this,(shared_ptr<chrono::fea::ChPlasticityKirchhoff> *)&_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  return;
}

Assistant:

ChMaterialShellKirchhoff::ChMaterialShellKirchhoff(std::shared_ptr<ChElasticityKirchhoff> melasticity,
												 std::shared_ptr<ChPlasticityKirchhoff> mplasticity) {
    this->SetElasticity(melasticity);
    this->SetPlasticity(mplasticity);
}